

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O0

Dec_Graph_t * Abc_NodeMffcConstants(Abc_ManRst_t *p,Vec_Int_t *vSims)

{
  int iVar1;
  Abc_ManRst_t *pAStack_28;
  uint uRoot;
  Dec_Graph_t *pGraph;
  Vec_Int_t *vSims_local;
  Abc_ManRst_t *p_local;
  
  pAStack_28 = (Abc_ManRst_t *)0x0;
  iVar1 = Vec_IntEntryLast(vSims);
  if (iVar1 == 0) {
    pAStack_28 = (Abc_ManRst_t *)Dec_GraphCreateConst0();
  }
  else if (iVar1 == -1) {
    pAStack_28 = (Abc_ManRst_t *)Dec_GraphCreateConst1();
  }
  if (pAStack_28 == (Abc_ManRst_t *)0x0) {
    __assert_fail("pGraph",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRestruct.c"
                  ,0x4f2,"Dec_Graph_t *Abc_NodeMffcConstants(Abc_ManRst_t *, Vec_Int_t *)");
  }
  iVar1 = Abc_NodeCheckFull(p,(Dec_Graph_t *)pAStack_28);
  if (iVar1 == 0) {
    Dec_GraphFree((Dec_Graph_t *)pAStack_28);
    p_local = (Abc_ManRst_t *)0x0;
  }
  else {
    p_local = pAStack_28;
  }
  return (Dec_Graph_t *)p_local;
}

Assistant:

Dec_Graph_t * Abc_NodeMffcConstants( Abc_ManRst_t * p, Vec_Int_t * vSims )
{
    Dec_Graph_t * pGraph = NULL;
    unsigned uRoot;
    // get the root node
    uRoot = (unsigned)Vec_IntEntryLast( vSims );
    // get the graph if the node looks constant
    if ( uRoot == 0 )
        pGraph = Dec_GraphCreateConst0();
    else if ( uRoot == ~(unsigned)0 )
        pGraph = Dec_GraphCreateConst1();
    // check the graph
    assert(pGraph);
    if ( Abc_NodeCheckFull( p, pGraph ) )
        return pGraph;
    Dec_GraphFree( pGraph );
    return NULL;
}